

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeError * __thiscall ExpressionContext::GetErrorType(ExpressionContext *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x60);
  TypeError::TypeError((TypeError *)CONCAT44(extraout_var,iVar1));
  return (TypeError *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ScopeData* NamedOrGlobalScopeFrom(ScopeData *scope)
	{
		if(!scope || scope->ownerNamespace || scope->scope == NULL)
			return scope;

		return NamedOrGlobalScopeFrom(scope->scope);
	}